

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O1

int __thiscall smf::Binasc::processDecimalWord(Binasc *this,ostream *out,string *word,int lineNum)

{
  pointer pcVar1;
  ushort value;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ostream *poVar5;
  int iVar6;
  long lVar7;
  char *pcVar8;
  ulong value_00;
  char cVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  char cVar13;
  int iVar14;
  ulong uVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  double value_01;
  char local_3a [4];
  char local_36;
  char local_35;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  
  uVar2 = (uint)word->_M_string_length;
  if ((int)uVar2 < 1) {
    iVar3 = -1;
    bVar17 = true;
    bVar16 = true;
    bVar18 = true;
    iVar6 = -1;
  }
  else {
    pcVar1 = (word->_M_dataplus)._M_p;
    iVar6 = -1;
    uVar15 = 0;
    uVar4 = 0xffffffff;
    iVar12 = -1;
    iVar11 = -1;
    iVar10 = -1;
    do {
      cVar9 = pcVar1[uVar15];
      iVar3 = (int)uVar4;
      iVar14 = (int)uVar15;
      switch(cVar9) {
      case '\'':
        if (iVar3 != -1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error on line ",0xe);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," at token: ",0xb);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,(word->_M_dataplus)._M_p,word->_M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          pcVar8 = "extra quote in decimal number";
          lVar7 = 0x1d;
          goto LAB_0011ce6d;
        }
        uVar4 = uVar15 & 0xffffffff;
        break;
      case '(':
      case ')':
      case '*':
      case '+':
      case ',':
      case '/':
switchD_0011c544_caseD_28:
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error on line ",0xe);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," at token: ",0xb);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(word->_M_dataplus)._M_p,word->_M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Invalid character in decimal number (character number ",
                   0x36);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
        cVar9 = (char)poVar5;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + cVar9);
        goto LAB_0011ce8f;
      case '-':
        if (iVar12 != -1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error on line ",0xe);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," at token: ",0xb);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,(word->_M_dataplus)._M_p,word->_M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          pcVar8 = "cannot have more than two minus signs in number";
          lVar7 = 0x2f;
          goto LAB_0011ce6d;
        }
        if ((uVar15 == 0) || (iVar12 = iVar14, pcVar1[uVar15 - 1] != '\'')) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error on line ",0xe);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," at token: ",0xb);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,(word->_M_dataplus)._M_p,word->_M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          pcVar8 = "minus sign must immediately follow quote mark";
          lVar7 = 0x2d;
          goto LAB_0011ce6d;
        }
        break;
      case '.':
        if (iVar3 == -1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error on line ",0xe);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," at token: ",0xb);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,(word->_M_dataplus)._M_p,word->_M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          pcVar8 = "cannot have decimal marker before quote";
          lVar7 = 0x27;
          goto LAB_0011ce6d;
        }
        bVar16 = iVar11 != -1;
        iVar11 = iVar14;
        if (bVar16) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error on line ",0xe);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," at token: ",0xb);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,(word->_M_dataplus)._M_p,word->_M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          pcVar8 = "extra period in decimal number";
          lVar7 = 0x1e;
          goto LAB_0011ce6d;
        }
        break;
      case '0':
      case '5':
      case '6':
      case '7':
      case '9':
        if (iVar3 == -1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error on line ",0xe);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," at token: ",0xb);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,(word->_M_dataplus)._M_p,word->_M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          pcVar8 = "cannot have numbers before quote in decimal number";
          lVar7 = 0x32;
          goto LAB_0011ce6d;
        }
        break;
      case '1':
      case '2':
      case '3':
      case '4':
      case '8':
        if ((iVar3 == -1) && (iVar6 != -1)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error on line ",0xe);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," at token: ",0xb);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,(word->_M_dataplus)._M_p,word->_M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"invalid byte specificaton before quote in ",0x2a);
          pcVar8 = "decimal number";
          lVar7 = 0xe;
          goto LAB_0011ce6d;
        }
        if (iVar3 == -1) {
          iVar6 = cVar9 + -0x30;
          uVar4 = 0xffffffff;
        }
        break;
      default:
        if ((cVar9 != 'U') && (cVar9 != 'u')) goto switchD_0011c544_caseD_28;
        if (iVar3 != -1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error on line ",0xe);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," at token: ",0xb);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,(word->_M_dataplus)._M_p,word->_M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          pcVar8 = "cannot have endian specified after quote";
          lVar7 = 0x28;
          goto LAB_0011ce6d;
        }
        if (iVar10 != -1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error on line ",0xe);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," at token: ",0xb);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,(word->_M_dataplus)._M_p,word->_M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          pcVar8 = "extra \"u\" in decimal number";
          lVar7 = 0x1b;
          goto LAB_0011ce6d;
        }
        uVar4 = 0xffffffff;
        iVar10 = iVar14;
      }
      iVar3 = (int)uVar4;
      uVar15 = uVar15 + 1;
    } while ((uVar2 & 0x7fffffff) != uVar15);
    bVar16 = iVar11 == -1;
    bVar17 = iVar10 == -1;
    bVar18 = iVar12 == -1;
  }
  if (iVar3 == -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error on line ",0xe);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," at token: ",0xb);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(word->_M_dataplus)._M_p,word->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    pcVar8 = "there must be a quote to signify a decimal number";
    lVar7 = 0x31;
LAB_0011ce6d:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar8,lVar7);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    cVar9 = ' ';
LAB_0011ce8f:
    std::ostream::put(cVar9);
    std::ostream::flush();
    return 0;
  }
  if (iVar3 == uVar2 - 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error on line ",0xe);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," at token: ",0xb);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(word->_M_dataplus)._M_p,word->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    pcVar8 = "there must be a decimal number after the quote";
    lVar7 = 0x2e;
    goto LAB_0011ce6d;
  }
  if ((bool)(iVar6 == 8 & bVar16)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error on line ",0xe);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," at token: ",0xb);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(word->_M_dataplus)._M_p,word->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    pcVar8 = "only floating-point numbers can use 8 bytes";
    lVar7 = 0x2b;
    goto LAB_0011ce6d;
  }
  iVar10 = 4;
  if (iVar6 != -1) {
    iVar10 = iVar6;
  }
  if (!bVar16) {
    value_01 = atof((word->_M_dataplus)._M_p + (long)iVar3 + 1);
    if (iVar10 == 8) {
      if (bVar17) {
        writeBigEndianDouble(out,value_01);
        return 1;
      }
      writeLittleEndianDouble(out,value_01);
      return 1;
    }
    if (iVar10 == 4) {
      if (bVar17) {
        writeBigEndianFloat(out,(float)value_01);
        return 1;
      }
      writeLittleEndianFloat(out,(float)value_01);
      return 1;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error on line ",0xe);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," at token: ",0xb);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(word->_M_dataplus)._M_p,word->_M_string_length);
    std::endl<char,std::char_traits<char>>(poVar5);
    pcVar8 = "floating-point numbers can be only 4 or 8 bytes";
    lVar7 = 0x2f;
LAB_0011d17e:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar8,lVar7);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    return 0;
  }
  switch(iVar6) {
  default:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error on line ",0xe);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," at token: ",0xb);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(word->_M_dataplus)._M_p,word->_M_string_length);
    std::endl<char,std::char_traits<char>>(poVar5);
    pcVar8 = "invalid byte count specification for decimal number";
    lVar7 = 0x33;
    goto LAB_0011d17e;
  case 1:
    uVar2 = atoi((word->_M_dataplus)._M_p + (long)iVar3 + 1);
    if (bVar18) {
      pcVar8 = local_3a + 3;
    }
    else {
      pcVar8 = local_3a + 2;
    }
    break;
  case 2:
    iVar3 = atoi((word->_M_dataplus)._M_p + (long)iVar3 + 1);
    value = (ushort)iVar3;
    if (!bVar18) {
      if (bVar17) {
        writeBigEndianShort(out,value);
        return 1;
      }
      writeLittleEndianShort(out,value);
      return 1;
    }
    if (bVar17) {
      writeBigEndianUShort(out,value);
      return 1;
    }
    writeLittleEndianUShort(out,value);
    return 1;
  case 3:
    if (!bVar18) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error on line ",0xe)
      ;
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," at token: ",0xb);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(word->_M_dataplus)._M_p,word->_M_string_length);
      std::endl<char,std::char_traits<char>>(poVar5);
      pcVar8 = "negative decimal numbers cannot be stored in 3 bytes";
      lVar7 = 0x34;
      goto LAB_0011d17e;
    }
    iVar3 = atoi((word->_M_dataplus)._M_p + (long)iVar3 + 1);
    cVar9 = (char)((uint)iVar3 >> 0x10);
    cVar13 = (char)((uint)iVar3 >> 8);
    if (bVar17) {
      local_36 = cVar9;
      std::__ostream_insert<char,std::char_traits<char>>(out,&local_36,1);
      local_35 = cVar13;
      std::__ostream_insert<char,std::char_traits<char>>(out,&local_35,1);
      pcVar8 = &local_34;
      local_34 = (char)iVar3;
    }
    else {
      local_33 = (char)iVar3;
      std::__ostream_insert<char,std::char_traits<char>>(out,&local_33,1);
      local_32 = cVar13;
      std::__ostream_insert<char,std::char_traits<char>>(out,&local_32,1);
      pcVar8 = &local_31;
      local_31 = cVar9;
    }
    goto LAB_0011d1bb;
  case 4:
    iVar3 = atoi((word->_M_dataplus)._M_p + (long)iVar3 + 1);
    value_00 = (ulong)iVar3;
    if (bVar18) {
      if (bVar17) {
        writeBigEndianULong(out,value_00);
      }
      else {
        writeLittleEndianULong(out,value_00);
      }
    }
    else if (bVar17) {
      writeBigEndianLong(out,value_00);
    }
    else {
      writeLittleEndianLong(out,value_00);
    }
    return 1;
  case -1:
    uVar2 = atoi((word->_M_dataplus)._M_p + (long)iVar3 + 1);
    if (bVar18) {
      if (0xff < uVar2) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error on line ",0xe);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," at token: ",0xb);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(word->_M_dataplus)._M_p,word->_M_string_length);
        std::endl<char,std::char_traits<char>>(poVar5);
        pcVar8 = "Decimal number out of range from 0 to 255";
        lVar7 = 0x29;
        goto LAB_0011d17e;
      }
      pcVar8 = local_3a + 1;
    }
    else {
      if ((int)(char)uVar2 != uVar2) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error on line ",0xe);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," at token: ",0xb);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(word->_M_dataplus)._M_p,word->_M_string_length);
        std::endl<char,std::char_traits<char>>(poVar5);
        pcVar8 = "Decimal number out of range from -128 to 127";
        lVar7 = 0x2c;
        goto LAB_0011d17e;
      }
      pcVar8 = local_3a;
    }
  }
  *pcVar8 = (char)uVar2;
LAB_0011d1bb:
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar8,1);
  return 1;
}

Assistant:

int Binasc::processDecimalWord(std::ostream& out, const std::string& word,
		int lineNum) {
	int length = (int)word.size();        // length of ascii binary number
	int byteCount = -1;              // number of bytes to output
	int quoteIndex = -1;             // index of decimal specifier
	int signIndex = -1;              // index of any sign for number
	int periodIndex = -1;            // index of period for floating point
	int endianIndex = -1;            // index of little endian specifier
	int i = 0;

	// make sure that all characters are valid
	for (i=0; i<length; i++) {
		switch (word[i]) {
			case '\'':
				if (quoteIndex != -1) {
					std::cerr << "Error on line " << lineNum << " at token: " << word
						  << std::endl;
					std::cerr << "extra quote in decimal number" << std::endl;
					return 0;
				} else {
					quoteIndex = i;
				}
				break;
			case '-':
				if (signIndex != -1) {
					std::cerr << "Error on line " << lineNum << " at token: " << word
						  << std::endl;
					std::cerr << "cannot have more than two minus signs in number"
						  << std::endl;
					return 0;
				} else {
					signIndex = i;
				}
				if (i == 0 || word[i-1] != '\'') {
					std::cerr << "Error on line " << lineNum << " at token: " << word
						  << std::endl;
					std::cerr << "minus sign must immediately follow quote mark" << std::endl;
					return 0;
				}
				break;
			case '.':
				if (quoteIndex == -1) {
					std::cerr << "Error on line " << lineNum << " at token: " << word
						  << std::endl;
					std::cerr << "cannot have decimal marker before quote" << std::endl;
					return 0;
				}
				if (periodIndex != -1) {
					std::cerr << "Error on line " << lineNum << " at token: " << word
						  << std::endl;
					std::cerr << "extra period in decimal number" << std::endl;
					return 0;
				} else {
					periodIndex = i;
				}
				break;
			case 'u':
			case 'U':
				if (quoteIndex != -1) {
					std::cerr << "Error on line " << lineNum << " at token: " << word
						  << std::endl;
					std::cerr << "cannot have endian specified after quote" << std::endl;
					return 0;
				}
				if (endianIndex != -1) {
					std::cerr << "Error on line " << lineNum << " at token: " << word
						  << std::endl;
					std::cerr << "extra \"u\" in decimal number" << std::endl;
					return 0;
				} else {
					endianIndex = i;
				}
				break;
			case '8':
			case '1': case '2': case '3': case '4':
				if (quoteIndex == -1 && byteCount != -1) {
					std::cerr << "Error on line " << lineNum << " at token: " << word
						  << std::endl;
					std::cerr << "invalid byte specificaton before quote in "
						  << "decimal number" << std::endl;
					return 0;
				} else if (quoteIndex == -1) {
					byteCount = word[i] - '0';
				}
				break;
			case '0': case '5': case '6': case '7': case '9':
				if (quoteIndex == -1) {
					std::cerr << "Error on line " << lineNum << " at token: " << word
						  << std::endl;
					std::cerr << "cannot have numbers before quote in decimal number"
						  << std::endl;
					return 0;
				}
				break;
			default:
				std::cerr << "Error on line " << lineNum << " at token: " << word
					  << std::endl;
				std::cerr << "Invalid character in decimal number"
						  " (character number " << i <<")" << std::endl;
				return 0;
		}
	}

	// there must be a quote character to indicate a decimal number
	// and there must be a decimal number after the quote
	if (quoteIndex == -1) {
		std::cerr << "Error on line " << lineNum << " at token: " << word
			  << std::endl;
		std::cerr << "there must be a quote to signify a decimal number" << std::endl;
		return 0;
	} else if (quoteIndex == length - 1) {
		std::cerr << "Error on line " << lineNum << " at token: " << word
			  << std::endl;
		std::cerr << "there must be a decimal number after the quote" << std::endl;
		return 0;
	}

	// 8 byte decimal output can only occur if reading a double number
	if (periodIndex == -1 && byteCount == 8) {
		std::cerr << "Error on line " << lineNum << " at token: " << word
			  << std::endl;
		std::cerr << "only floating-point numbers can use 8 bytes" << std::endl;
		return 0;
	}

	// default size for floating point numbers is 4 bytes
	if (periodIndex != -1) {
		if (byteCount == -1) {
			byteCount = 4;
		}
	}

	// process any floating point numbers possibilities
	if (periodIndex != -1) {
		double doubleOutput = atof(&word[quoteIndex+1]);
		float  floatOutput  = (float)doubleOutput;
		switch (byteCount) {
			case 4:
			  if (endianIndex == -1) {
				  writeBigEndianFloat(out, floatOutput);
			  } else {
				  writeLittleEndianFloat(out, floatOutput);
			  }
			  return 1;
			  break;
			case 8:
			  if (endianIndex == -1) {
				  writeBigEndianDouble(out, doubleOutput);
			  } else {
				  writeLittleEndianDouble(out, doubleOutput);
			  }
			  return 1;
			  break;
			default:
				std::cerr << "Error on line " << lineNum << " at token: " << word
					  << std::endl;
				std::cerr << "floating-point numbers can be only 4 or 8 bytes" << std::endl;
				return 0;
		}
	}

	// process any integer decimal number possibilities

	// default integer size is one byte, if size is not specified, then
	// the number must be in the one byte range and cannot overflow
	// the byte if the size of the decimal number is not specified
	if (byteCount == -1) {
		if (signIndex != -1) {
			long tempLong = atoi(&word[quoteIndex + 1]);
			if (tempLong > 127 || tempLong < -128) {
				std::cerr << "Error on line " << lineNum << " at token: " << word
					  << std::endl;
				std::cerr << "Decimal number out of range from -128 to 127" << std::endl;
				return 0;
			}
			char charOutput = (char)tempLong;
			out << charOutput;
			return 1;
		} else {
			ulong tempLong = (ulong)atoi(&word[quoteIndex + 1]);
			uchar ucharOutput = (uchar)tempLong;
			if (tempLong > 255) { // || (tempLong < 0)) {
				std::cerr << "Error on line " << lineNum << " at token: " << word
					  << std::endl;
				std::cerr << "Decimal number out of range from 0 to 255" << std::endl;
				return 0;
			}
			out << ucharOutput;
			return 1;
		}
	}

	// left with an integer number with a specified number of bytes
	switch (byteCount) {
		case 1:
			if (signIndex != -1) {
				long tempLong = atoi(&word[quoteIndex + 1]);
				char charOutput = (char)tempLong;
				out << charOutput;
				return 1;
			} else {
				ulong tempLong = (ulong)atoi(&word[quoteIndex + 1]);
				uchar ucharOutput = (uchar)tempLong;
				out << ucharOutput;
				return 1;
			}
			break;
		case 2:
			if (signIndex != -1) {
				long tempLong = atoi(&word[quoteIndex + 1]);
				short shortOutput = (short)tempLong;
				if (endianIndex == -1) {
					writeBigEndianShort(out, shortOutput);
				} else {
					writeLittleEndianShort(out, shortOutput);
				}
				return 1;
			} else {
				ulong tempLong = (ulong)atoi(&word[quoteIndex + 1]);
				ushort ushortOutput = (ushort)tempLong;
				if (endianIndex == -1) {
					writeBigEndianUShort(out, ushortOutput);
				} else {
					writeLittleEndianUShort(out, ushortOutput);
				}
				return 1;
			}
			break;
		case 3:
			{
			if (signIndex != -1) {
				std::cerr << "Error on line " << lineNum << " at token: " << word
					  << std::endl;
				std::cerr << "negative decimal numbers cannot be stored in 3 bytes"
					  << std::endl;
				return 0;
			}
			ulong tempLong = (ulong)atoi(&word[quoteIndex + 1]);
			uchar byte1 = (uchar)((tempLong & 0x00ff0000) >> 16);
			uchar byte2 = (uchar)((tempLong & 0x0000ff00) >> 8);
			uchar byte3 = (uchar)((tempLong & 0x000000ff));
			if (endianIndex == -1) {
				out << byte1;
				out << byte2;
				out << byte3;
			} else {
				out << byte3;
				out << byte2;
				out << byte1;
			}
			return 1;
			}
			break;
		case 4:
			if (signIndex != -1) {
				long tempLong = atoi(&word[quoteIndex + 1]);
				if (endianIndex == -1) {
					writeBigEndianLong(out, tempLong);
				} else {
					writeLittleEndianLong(out, tempLong);
				}
				return 1;
			} else {
				ulong tempuLong = (ulong)atoi(&word[quoteIndex + 1]);
				if (endianIndex == -1) {
					writeBigEndianULong(out, tempuLong);
				} else {
					writeLittleEndianULong(out, tempuLong);
				}
				return 1;
			}
			break;
		default:
			std::cerr << "Error on line " << lineNum << " at token: " << word
				  << std::endl;
			std::cerr << "invalid byte count specification for decimal number" << std::endl;
			return 0;
	}

	return 1;
}